

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O3

int CBS_get_u32le(CBS *cbs,uint32_t *out)

{
  uint8_t *puVar1;
  int iVar2;
  size_t i;
  long lVar3;
  uint uVar4;
  uint uVar6;
  uint uVar5;
  
  iVar2 = 0;
  if (3 < cbs->len) {
    puVar1 = cbs->data;
    cbs->data = puVar1 + 4;
    cbs->len = cbs->len - 4;
    lVar3 = 0;
    uVar4 = 0;
    do {
      uVar6 = uVar4 << 8;
      uVar5 = (uint)puVar1[lVar3];
      uVar4 = uVar5 | uVar6;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    *out = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar5 << 0x18;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int cbs_get(CBS *cbs, const uint8_t **p, size_t n) {
  if (cbs->len < n) {
    return 0;
  }

  *p = cbs->data;
  cbs->data += n;
  cbs->len -= n;
  return 1;
}